

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O3

bool __thiscall
lzham::task_pool::
queue_multiple_object_tasks<lzham::search_accelerator,void(lzham::search_accelerator::*)(unsigned_long_long,void*)>
          (task_pool *this,search_accelerator *pObject,
          offset_in_search_accelerator_to_subr pObject_method,uint64 first_data,uint num_tasks,
          void *pData_ptr)

{
  int iVar1;
  int iVar2;
  task_callback_func p_Var3;
  ulong uVar4;
  undefined4 in_register_00000084;
  long lVar5;
  bool bVar6;
  void *in_stack_00000008;
  
  if ((int)pData_ptr == 0) {
    bVar6 = true;
  }
  else {
    uVar4 = 0;
    do {
      p_Var3 = (task_callback_func)lzham_malloc(0x28,(size_t *)0x0);
      if (p_Var3 == (task_callback_func)0x0) {
LAB_0010dd8a:
        bVar6 = false;
        if (uVar4 == 0) {
          return false;
        }
        goto LAB_0010dd92;
      }
      *(undefined ***)p_Var3 = &PTR_execute_task_00123d68;
      *(search_accelerator **)(p_Var3 + 8) = pObject;
      *(offset_in_search_accelerator_to_subr *)(p_Var3 + 0x10) = pObject_method;
      *(uint64 *)(p_Var3 + 0x18) = first_data;
      *(undefined4 *)(p_Var3 + 0x20) = 1;
      iVar1 = pthread_spin_lock((pthread_spinlock_t *)this);
      if (iVar1 != 0) {
        lzham_fail("\"spinlock: pthread_spin_lock() failed\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                   ,0x72);
      }
      iVar1 = (this->m_task_stack).m_top;
      lVar5 = (long)iVar1;
      if (lVar5 < 0x10) {
        (this->m_task_stack).m_top = iVar1 + 1;
        (this->m_task_stack).m_stack[lVar5].m_data =
             CONCAT44(in_register_00000084,num_tasks) + uVar4;
        (this->m_task_stack).m_stack[lVar5].m_pData_ptr = in_stack_00000008;
        (this->m_task_stack).m_stack[lVar5].field_2.m_callback = p_Var3;
        (this->m_task_stack).m_stack[lVar5].m_flags = 1;
      }
      iVar2 = pthread_spin_unlock((pthread_spinlock_t *)this);
      if (iVar2 != 0) {
        lzham_fail("\"spinlock: pthread_spin_unlock() failed\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                   ,0x7a);
      }
      if (0xf < iVar1) goto LAB_0010dd8a;
      uVar4 = uVar4 + 1;
    } while (((ulong)pData_ptr & 0xffffffff) != uVar4);
    bVar6 = true;
    uVar4 = (ulong)pData_ptr & 0xffffffff;
LAB_0010dd92:
    LOCK();
    this->m_num_outstanding_tasks = this->m_num_outstanding_tasks + uVar4;
    UNLOCK();
    lVar5 = uVar4 + 1;
    do {
      iVar1 = sem_post((sem_t *)&this->m_tasks_available);
      if (iVar1 != 0) {
        lzham_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                   ,0x3b);
        return bVar6;
      }
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  return bVar6;
}

Assistant:

inline bool task_pool::queue_multiple_object_tasks(S* pObject, T pObject_method, uint64 first_data, uint num_tasks, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObject);
      LZHAM_ASSERT(num_tasks);
      if (!num_tasks)
         return true;

      bool status = true;

      uint i;
      for (i = 0; i < num_tasks; i++)
      {
         task tsk;

         tsk.m_pObj = lzham_new< object_task<S> >(pObject, pObject_method, cObjectTaskFlagDeleteAfterExecution);
         if (!tsk.m_pObj)
         {
            status = false;
            break;
         }

         tsk.m_data = first_data + i;
         tsk.m_pData_ptr = pData_ptr;
         tsk.m_flags = cTaskFlagObject;

         if (!m_task_stack.try_push(tsk))
         {
            status = false;
            break;
         }
      }

      if (i)
      {
         atomic_add32(&m_num_outstanding_tasks, i);

         m_tasks_available.release(i);
      }

      return status;
   }